

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapper_2.cpp
# Opt level: O0

void __thiscall n_e_s::core::Mapper2::ppu_write_byte(Mapper2 *this,uint16_t addr,uint8_t byte)

{
  value_type_conflict1 vVar1;
  uint16_t addr_00;
  Mirroring m;
  reference pvVar2;
  INesHeader *this_00;
  pair<int,_unsigned_short> pVar3;
  type_conflict4 *ptVar4;
  type_conflict5 *ptVar5;
  reference this_01;
  reference pvVar6;
  type *addr_mod;
  type *index;
  unsigned_short local_18;
  value_type_conflict1 local_13;
  uint16_t local_12;
  uint8_t byte_local;
  Mapper2 *pMStack_10;
  uint16_t addr_local;
  Mapper2 *this_local;
  
  local_13 = byte;
  local_12 = addr;
  pMStack_10 = this;
  if (addr < 0x2000) {
    pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                       (&this->chr_mem_,(ulong)addr);
    *pvVar2 = byte;
  }
  addr_00 = local_12;
  this_00 = IRom::header(&this->super_IRom);
  m = INesHeader::mirroring(this_00);
  pVar3 = translate_nametable_addr(this,addr_00,m);
  index._4_4_ = pVar3.first;
  local_18 = pVar3.second;
  ptVar4 = std::get<0ul,int,unsigned_short>((pair<int,_unsigned_short> *)((long)&index + 4));
  ptVar5 = std::get<1ul,int,unsigned_short>((pair<int,_unsigned_short> *)((long)&index + 4));
  vVar1 = local_13;
  this_01 = std::array<std::array<unsigned_char,_1024UL>,_2UL>::operator[]
                      (&this->nametables_,(long)*ptVar4);
  pvVar6 = std::array<unsigned_char,_1024UL>::operator[](this_01,(ulong)*ptVar5);
  *pvVar6 = vVar1;
  return;
}

Assistant:

void Mapper2::ppu_write_byte(uint16_t addr, uint8_t byte) {
    if (addr <= kChrEnd) {
        chr_mem_.at(addr) = byte;
    }
    const auto [index, addr_mod] =
            translate_nametable_addr(addr, header().mirroring());
    nametables_[index][addr_mod] = byte;
}